

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_ECH_KEYS_add(SSL_ECH_KEYS *configs,int is_retry_config,uint8_t *ech_config,
                    size_t ech_config_len,EVP_HPKE_KEY *key)

{
  bool bVar1;
  pointer this;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> local_70 [3];
  Span<const_unsigned_char> local_58;
  undefined4 local_44;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> local_40;
  UniquePtr<ECHServerConfig> parsed_config;
  EVP_HPKE_KEY *key_local;
  size_t ech_config_len_local;
  uint8_t *ech_config_local;
  int is_retry_config_local;
  SSL_ECH_KEYS *configs_local;
  
  parsed_config._M_t.super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::ECHServerConfig,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bssl::ECHServerConfig,_bssl::internal::Deleter,_true,_true>)key;
  bssl::MakeUnique<bssl::ECHServerConfig>();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40);
  if (bVar1) {
    this = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->(&local_40);
    bssl::Span<const_unsigned_char>::Span(&local_58,ech_config,ech_config_len);
    bVar1 = bssl::ECHServerConfig::Init
                      (this,local_58,
                       (EVP_HPKE_KEY *)
                       parsed_config._M_t.
                       super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl,
                       is_retry_config != 0);
    if (bVar1) {
      std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::unique_ptr
                (local_70,&local_40);
      bVar1 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::Push
                        (&configs->configs,local_70);
      std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::~unique_ptr(local_70);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        configs_local._4_4_ = 1;
      }
      else {
        configs_local._4_4_ = 0;
      }
    }
    else {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x40f);
      configs_local._4_4_ = 0;
    }
  }
  else {
    configs_local._4_4_ = 0;
  }
  local_44 = 1;
  std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  return configs_local._4_4_;
}

Assistant:

int SSL_ECH_KEYS_add(SSL_ECH_KEYS *configs, int is_retry_config,
                     const uint8_t *ech_config, size_t ech_config_len,
                     const EVP_HPKE_KEY *key) {
  UniquePtr<ECHServerConfig> parsed_config = MakeUnique<ECHServerConfig>();
  if (!parsed_config) {
    return 0;
  }
  if (!parsed_config->Init(Span(ech_config, ech_config_len), key,
                           !!is_retry_config)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }
  if (!configs->configs.Push(std::move(parsed_config))) {
    return 0;
  }
  return 1;
}